

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixie_provider.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::pixie::PixieProvider::PixieProvider
          (PixieProvider *this,UserInfo *user_info)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  size_type sVar1;
  NameCache *this_01;
  pointer *__ptr;
  string local_b8;
  PriceSyncDecoder *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"static://highway","");
  provider::AbstractProvider::AbstractProvider(&this->super_AbstractProvider,user_info,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (this->super_AbstractProvider).super_Provider.super_Subscriber._vptr_Subscriber =
       (_func_int **)&PTR_Subscribe_001e6ce0;
  PixieProtocolOptions::PixieProtocolOptions(&this->protocol_options_);
  (this->writer_thread_count_).super___atomic_base<int>._M_i = 0;
  PriceSyncDecoder::PriceSyncDecoder(&this->price_sync_decoder_);
  (this->ack_queue_).mutex_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->ack_queue_).mutex_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->ack_queue_).mutex_.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->ack_queue_).mutex_.super___mutex_base._M_mutex + 0x10) = 0;
  (this->data_dictionary_)._M_t.
  super___uniq_ptr_impl<bidfx_public_api::price::pixie::IDataDictionary,_std::default_delete<bidfx_public_api::price::pixie::IDataDictionary>_>
  ._M_t.
  super__Tuple_impl<0UL,_bidfx_public_api::price::pixie::IDataDictionary_*,_std::default_delete<bidfx_public_api::price::pixie::IDataDictionary>_>
  .super__Head_base<0UL,_bidfx_public_api::price::pixie::IDataDictionary_*,_false>._M_head_impl =
       (IDataDictionary *)0x0;
  (this->ack_queue_).mutex_.super___mutex_base._M_mutex.__align = 0;
  std::condition_variable::condition_variable(&(this->ack_queue_).condition_);
  (this->ack_queue_).queue_.
  super__Deque_base<bidfx_public_api::price::pixie::AckData,_std::allocator<bidfx_public_api::price::pixie::AckData>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->ack_queue_).queue_.
  super__Deque_base<bidfx_public_api::price::pixie::AckData,_std::allocator<bidfx_public_api::price::pixie::AckData>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->ack_queue_).queue_.
  super__Deque_base<bidfx_public_api::price::pixie::AckData,_std::allocator<bidfx_public_api::price::pixie::AckData>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->ack_queue_).queue_.
  super__Deque_base<bidfx_public_api::price::pixie::AckData,_std::allocator<bidfx_public_api::price::pixie::AckData>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->ack_queue_).queue_.
  super__Deque_base<bidfx_public_api::price::pixie::AckData,_std::allocator<bidfx_public_api::price::pixie::AckData>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->ack_queue_).queue_.
  super__Deque_base<bidfx_public_api::price::pixie::AckData,_std::allocator<bidfx_public_api::price::pixie::AckData>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->ack_queue_).queue_.
  super__Deque_base<bidfx_public_api::price::pixie::AckData,_std::allocator<bidfx_public_api::price::pixie::AckData>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->ack_queue_).queue_.
  super__Deque_base<bidfx_public_api::price::pixie::AckData,_std::allocator<bidfx_public_api::price::pixie::AckData>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->ack_queue_).queue_.
  super__Deque_base<bidfx_public_api::price::pixie::AckData,_std::allocator<bidfx_public_api::price::pixie::AckData>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->ack_queue_).queue_.
  super__Deque_base<bidfx_public_api::price::pixie::AckData,_std::allocator<bidfx_public_api::price::pixie::AckData>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_98 = &this->price_sync_decoder_;
  std::
  _Deque_base<bidfx_public_api::price::pixie::AckData,_std::allocator<bidfx_public_api::price::pixie::AckData>_>
  ::_M_initialize_map(&(this->ack_queue_).queue_.
                       super__Deque_base<bidfx_public_api::price::pixie::AckData,_std::allocator<bidfx_public_api::price::pixie::AckData>_>
                      ,0);
  SubjectSetRegister::SubjectSetRegister(&this->subject_set_register_);
  (this->subscription_interval_).__r = 200;
  (this->last_subscription_check_time_).__d.__r = 0;
  (this->last_write_time_).__d.__r = 0;
  (this->disconnection_triggered_)._M_base._M_i = false;
  if (Log._M_p == (pointer)0x0) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"PixieProvider","");
    tools::LoggerFactory::GetLogger((LoggerFactory *)&local_b8,&local_70);
    sVar1 = local_b8._M_string_length;
    Log._M_p = local_b8._M_dataplus._M_p;
    this_00 = DAT_001ece38;
    local_b8._M_dataplus._M_p = (pointer)0x0;
    local_b8._M_string_length = 0;
    DAT_001ece38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar1;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  this->user_info_ = user_info;
  this_01 = tools::NameCache::GetDefault();
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"PixieProvider","");
  tools::NameCache::CreateUniqueName(&local_b8,this_01,&local_90);
  std::__cxx11::string::operator=
            ((string *)&(this->super_AbstractProvider).name_,(string *)&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

PixieProvider::PixieProvider(UserInfo* user_info) : AbstractProvider(user_info, "static://highway"), protocol_options_(PixieProtocolOptions())
{
    if (Log == nullptr)
    {
        Log = LoggerFactory::GetLogger("PixieProvider");
    }

    user_info_ = user_info;
    name_ = NameCache::GetDefault().CreateUniqueName("PixieProvider");
}